

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorExactAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  long lVar1;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  if (0 < (long)im->colorsTotal) {
    lVar1 = 0;
    do {
      if ((((im->open[lVar1] == 0) && (im->red[lVar1] == r)) && (im->green[lVar1] == g)) &&
         ((im->blue[lVar1] == b && (im->alpha[lVar1] == a)))) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (im->colorsTotal != lVar1);
  }
  return -1;
}

Assistant:

BGD_DECLARE(int) gdImageColorExactAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			continue;
		}
		if ((im->red[i] == r) &&
		        (im->green[i] == g) && (im->blue[i] == b) && (im->alpha[i] == a)) {
			return i;
		}
	}
	return -1;
}